

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::undoLast_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this)

{
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_00;
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  pair<int,_int> pVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  value_type local_40;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  if ((this->last_diff).
      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      _M_node._M_size != 0) {
    lVar4 = (long)(this->last_mem).first.first;
    if (-1 < lVar4) {
      *(pair<int,_int> *)
       (*(long *)&(this->A).
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar4].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data + (long)(this->last_mem).first.second * 8) =
           (this->last_mem).second;
    }
    this_00 = &this->last_diff;
    p_Var7 = (_List_node_base *)this_00;
    while (p_Var7 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)this_00) {
      pVar5 = Collimator::indexToPos(this->collimator,*(int *)&p_Var7[1]._M_next,this->angle);
      pdVar1 = (this->I).p[pVar5.first];
      pdVar1[(long)pVar5 >> 0x20] = pdVar1[(long)pVar5 >> 0x20] - (double)p_Var7[1]._M_prev;
      local_40.second = (double)((ulong)p_Var7[1]._M_prev ^ (ulong)DAT_001285e0);
      local_40.first = *(int *)&p_Var7[1]._M_next;
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      push_back(__return_storage_ptr__,&local_40);
    }
    pdVar2 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar6 = (ulong)(uint)this->max_apertures;
    if (this->max_apertures < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      pdVar3[uVar8] = pdVar2[uVar8];
    }
    (this->last_mem).first.first = -1;
    (this->last_mem).first.second = -1;
    (this->last_mem).second.first = -1;
    (this->last_mem).second.second = -1;
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::clear
              (this_00);
    pdVar2 = (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar2) {
      (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair<int,double> > Station::undoLast () {
    list <pair<int,double> > undo_diff;
    //if (last_mem.first.first<0) {
      //return(undo_diff);
    //}
    pair<int,int> coord;
    
    if (last_diff.size()< 1) return(undo_diff);

    if (last_mem.first.first>=0)
      A[last_mem.first.first][last_mem.first.second] = last_mem.second;

    for (list<pair<int,double> >::iterator it=last_diff.begin();it!=last_diff.end();it++) {
      coord=collimator.indexToPos(it->first, angle);
      I(coord.first,coord.second) = I(coord.first,coord.second) - (it->second);
      undo_diff.push_back(make_pair(it->first, -(it->second)));
    }
    
    for (int i=0;i<max_apertures;i++) {
      intensity[i]=last_intensity[i];
    }

    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_diff.clear();
    last_intensity.clear();

    return(undo_diff);
  }